

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetUInt64
          (OptionInterpreter *this,int number,uint64 value,Type type,UnknownFieldSet *unknown_fields
          )

{
  LogMessage *pLVar1;
  LogFinisher local_75 [13];
  LogMessage local_68;
  UnknownFieldSet *local_30;
  UnknownFieldSet *unknown_fields_local;
  uint64 uStack_20;
  Type type_local;
  uint64 value_local;
  OptionInterpreter *pOStack_10;
  int number_local;
  OptionInterpreter *this_local;
  
  local_30 = unknown_fields;
  unknown_fields_local._4_4_ = type;
  uStack_20 = value;
  value_local._4_4_ = number;
  pOStack_10 = this;
  if (type == TYPE_UINT64) {
    UnknownFieldSet::AddVarint(unknown_fields,number,value);
  }
  else if (type == TYPE_FIXED64) {
    UnknownFieldSet::AddFixed64(unknown_fields,number,value);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x134f);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"Invalid wire type for CPPTYPE_UINT64: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,unknown_fields_local._4_4_);
    internal::LogFinisher::operator=(local_75,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetUInt64(int number, uint64 value,
    FieldDescriptor::Type type, UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_UINT64:
      unknown_fields->AddVarint(number, value);
      break;

    case FieldDescriptor::TYPE_FIXED64:
      unknown_fields->AddFixed64(number, value);
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_UINT64: " << type;
      break;
  }
}